

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.h
# Opt level: O2

HMInteger __thiscall hypermind::CompileUnit::CreateLable(CompileUnit *this)

{
  uint in_EAX;
  HMUINT32 HVar1;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  HVar1 = Buffer<unsigned_int>::push
                    (&this->mLables,&this->mVM->mGCHeap,(uint *)((long)&uStack_8 + 4));
  return HVar1;
}

Assistant:

HMInteger CreateLable() {
            return mLables.push(&mVM->mGCHeap, 0);
        }